

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

void __thiscall Clasp::Solver::ccResolve(Solver *this,LitVec *cc,uint32 pos,LitVec *reason)

{
  size_type *psVar1;
  pointer pDVar2;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  pointer pLVar6;
  pointer puVar7;
  ulong in_RAX;
  size_type i;
  uint uVar8;
  long *plVar9;
  undefined8 uStack_38;
  
  plVar9 = (long *)((this->heuristic_).ptr_ & 0xfffffffffffffffe);
  uStack_38 = in_RAX;
  (**(code **)(*plVar9 + 0x50))(plVar9,this,reason,(cc->ebo_).buf[pos].rep_);
  for (uVar8 = 0; uVar8 != (reason->ebo_).size; uVar8 = uVar8 + 1) {
    uVar4 = (reason->ebo_).buf[uVar8].rep_;
    uVar5 = *(uint *)((long)(this->assign_).assign_.ebo_.buf + (ulong)(uVar4 & 0xfffffffc));
    if ((uVar5 & 0xc) == 0) {
      pDVar2 = (this->levels_).super_type.ebo_.buf + ((uVar5 >> 4) - 1);
      *(uint *)pDVar2 = *(uint *)pDVar2 | 0x40000000;
      uStack_38 = CONCAT44(uVar4,(undefined4)uStack_38) & 0xfffffffeffffffff ^ 0x200000000;
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                (cc,(Literal *)((long)&uStack_38 + 4));
    }
  }
  pLVar6 = (cc->ebo_).buf;
  puVar7 = (this->assign_).assign_.ebo_.buf;
  puVar3 = (uint *)((long)puVar7 + (ulong)(pLVar6[pos].rep_ & 0xfffffffc));
  *puVar3 = *puVar3 & 0xfffffff3;
  pDVar2 = (this->levels_).super_type.ebo_.buf +
           ((*(uint *)((long)puVar7 + (ulong)(pLVar6[pos].rep_ & 0xfffffffc)) >> 4) - 1);
  *(uint *)pDVar2 = *(uint *)pDVar2 & 0xbfffffff;
  pLVar6 = (cc->ebo_).buf;
  pLVar6[pos].rep_ = pLVar6[(cc->ebo_).size - 1].rep_;
  psVar1 = &(cc->ebo_).size;
  *psVar1 = *psVar1 - 1;
  return;
}

Assistant:

void Solver::ccResolve(LitVec& cc, uint32 pos, const LitVec& reason) {
	heuristic_->updateReason(*this, reason, cc[pos]);
	Literal x;
	for (LitVec::size_type i = 0; i != reason.size(); ++i) {
		x = reason[i];
		assert(isTrue(x));
		if (!seen(x.var())) {
			markLevel(level(x.var()));
			cc.push_back(~x);
		}
	}
	clearSeen(cc[pos].var());
	unmarkLevel(level(cc[pos].var()));
	cc[pos] = cc.back();
	cc.pop_back();
}